

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  FieldDescriptor *field;
  TypeInfo *pTVar1;
  Descriptor *pDVar2;
  ulong uVar3;
  long lVar4;
  DynamicMessageFactory *pDVar5;
  bool bVar6;
  CppType CVar7;
  int iVar8;
  undefined4 uVar9;
  InternalMetadata *this_00;
  DynamicMapField *this_01;
  Descriptor *pDVar10;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar11;
  Message *default_entry;
  int i;
  long lVar12;
  long lVar13;
  Arena *pAVar14;
  int i_1;
  _func_int **pp_Var15;
  
  pTVar1 = this->type_info_;
  pDVar2 = pTVar1->type;
  lVar13 = 0x20;
  iVar8 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(pDVar2 + 0x68); lVar12 = lVar12 + 1) {
    if ((*(int *)(*(long *)(pDVar2 + 0x30) + -0x1c + lVar13) != 1) ||
       ((*(byte *)(*(long *)(*(long *)(pDVar2 + 0x30) + lVar13) + 1) & 2) == 0)) {
      *(undefined4 *)
       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
       (long)(iVar8 * 4 + pTVar1->oneof_case_offset)) = 0;
      iVar8 = iVar8 + 1;
    }
    lVar13 = lVar13 + 0x28;
  }
  if ((long)pTVar1->extensions_offset != -1) {
    uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    internal::ExtensionSet::ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
               (long)pTVar1->extensions_offset),pAVar14);
  }
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  lVar13 = 0;
  lVar12 = 0;
  do {
    if (*(int *)(pDVar2 + 4) <= lVar12) {
      return;
    }
    lVar4 = *(long *)(pDVar2 + 0x28);
    field = (FieldDescriptor *)(lVar4 + lVar13);
    this_01 = (DynamicMapField *)MutableRaw(this,(int)lVar12);
    bVar6 = anon_unknown_0::InRealOneof(field);
    if (!bVar6) {
      CVar7 = FieldDescriptor::cpp_type(field);
      switch(CVar7) {
      case CPPTYPE_INT32:
      case CPPTYPE_UINT32:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) goto LAB_0038dbc4;
        uVar9 = *(undefined4 *)(lVar4 + 0x40 + lVar13);
LAB_0038db9b:
        *(undefined4 *)
         &(this_01->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = uVar9;
        break;
      case CPPTYPE_INT64:
      case CPPTYPE_UINT64:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) goto LAB_0038dbc4;
        pp_Var15 = *(_func_int ***)(lVar4 + 0x40 + lVar13);
LAB_0038daed:
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase._vptr_MapFieldBase = pp_Var15;
        break;
      case CPPTYPE_DOUBLE:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) goto LAB_0038dbc4;
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase._vptr_MapFieldBase = *(_func_int ***)(lVar4 + 0x40 + lVar13);
        break;
      case CPPTYPE_FLOAT:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) goto LAB_0038dbc4;
        *(undefined4 *)
         &(this_01->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = *(undefined4 *)(lVar4 + 0x40 + lVar13);
        break;
      case CPPTYPE_BOOL:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) goto LAB_0038dbc4;
        *(undefined1 *)
         &(this_01->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = *(undefined1 *)(lVar4 + 0x40 + lVar13);
        break;
      case CPPTYPE_ENUM:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) != 0) {
          pEVar11 = FieldDescriptor::default_value_enum(field);
          uVar9 = *(undefined4 *)(pEVar11 + 4);
          goto LAB_0038db9b;
        }
LAB_0038dbc4:
        pAVar14 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          pAVar14 = *(Arena **)pAVar14;
        }
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase.arena_ = pAVar14;
        break;
      case CPPTYPE_STRING:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) != 0) {
          if (*(long *)(*(long *)(lVar4 + 0x40 + lVar13) + 8) == 0) {
            pp_Var15 = (_func_int **)&internal::fixed_address_empty_string_abi_cxx11_;
          }
          else {
            pp_Var15 = (_func_int **)0x0;
          }
          goto LAB_0038daed;
        }
        pp_Var15 = (_func_int **)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          pp_Var15 = (_func_int **)*pp_Var15;
        }
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase._vptr_MapFieldBase = pp_Var15;
LAB_0038dc50:
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase.arena_ = (Arena *)0x0;
        (this_01->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)0x0;
        break;
      case CPPTYPE_MESSAGE:
        if ((~*(byte *)(lVar4 + 1 + lVar13) & 0x60) == 0) {
          bVar6 = FieldDescriptor::is_map(field);
          uVar3 = this_00->ptr_;
          pp_Var15 = (_func_int **)(uVar3 & 0xfffffffffffffffc);
          if (!bVar6) {
            if ((uVar3 & 1) != 0) {
              pp_Var15 = (_func_int **)*pp_Var15;
            }
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = pp_Var15;
            goto LAB_0038dc50;
          }
          if (lock_factory) {
            if ((uVar3 & 1) != 0) {
              pp_Var15 = (_func_int **)*pp_Var15;
            }
            pDVar5 = this->type_info_->factory;
            pDVar10 = FieldDescriptor::message_type(field);
            iVar8 = (*(pDVar5->super_MessageFactory)._vptr_MessageFactory[2])(pDVar5,pDVar10);
            default_entry = (Message *)CONCAT44(extraout_var,iVar8);
          }
          else {
            if ((uVar3 & 1) != 0) {
              pp_Var15 = (_func_int **)*pp_Var15;
            }
            pDVar5 = this->type_info_->factory;
            pDVar10 = FieldDescriptor::message_type(field);
            default_entry = DynamicMessageFactory::GetPrototypeNoLock(pDVar5,pDVar10);
          }
          if (pp_Var15 == (_func_int **)0x0) {
            internal::DynamicMapField::DynamicMapField(this_01,default_entry);
          }
          else {
            pAVar14 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar14 = *(Arena **)pAVar14;
            }
            internal::DynamicMapField::DynamicMapField(this_01,default_entry,pAVar14);
            pAVar14 = internal::InternalMetadata::owning_arena(this_00);
            if ((pAVar14 != (Arena *)0x0) &&
               (pAVar14 = internal::InternalMetadata::owning_arena(this_00),
               this_01 != (DynamicMapField *)0x0)) {
              internal::ThreadSafeArena::AddCleanup
                        ((ThreadSafeArena *)pAVar14,this_01,
                         internal::
                         arena_destruct_object<google::protobuf::internal::DynamicMapField>);
            }
          }
        }
        else {
          (this_01->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
        }
      }
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x48;
  } while( true );
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->type;
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->oneof_decl_count(); ++i) {
    if (descriptor->oneof_decl(i)->is_synthetic()) continue;
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(GetArenaForAllocation());
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
    if (!field->is_repeated()) {                                    \
      new (field_ptr) TYPE(field->default_value_##TYPE());          \
    } else {                                                        \
      new (field_ptr) RepeatedField<TYPE>(GetArenaForAllocation()); \
    }                                                               \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(GetArenaForAllocation());
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            if (!field->is_repeated()) {
              const std::string* default_value =
                  field->default_value_string().empty()
                      ? &internal::GetEmptyStringAlreadyInited()
                      : nullptr;
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(default_value);
            } else {
              new (field_ptr)
                  RepeatedPtrField<std::string>(GetArenaForAllocation());
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            if (lock_factory) {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()),
                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()));
              }
            } else {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                                        field->message_type()),
                                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                        field->message_type()));
              }
            }
          } else {
            new (field_ptr) RepeatedPtrField<Message>(GetArenaForAllocation());
          }
        }
        break;
      }
    }
  }
}